

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O2

bool __thiscall cmCTestUpdateHandler::SelectVCS(cmCTestUpdateHandler *this)

{
  cmCTest *pcVar1;
  int iVar2;
  string *dir;
  ostream *poVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  char *local_340 [4];
  ostringstream cmCTestLog_msg;
  ostringstream e;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"UpdateCommand",(allocator<char> *)local_340);
  cmCTest::GetCTestConfiguration((string *)&e,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"SourceDirectory",(allocator<char> *)&cmCTestLog_msg);
  dir = (string *)cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&e);
  if (dir == (string *)0x0) {
    dir = &cmValue::Empty_abi_cxx11_;
  }
  iVar2 = DetectVCS(this,dir);
  this->UpdateType = iVar2;
  std::__cxx11::string::~string((string *)&e);
  if (this->UpdateType == 0) {
    pcVar6 = (this->UpdateCommand)._M_dataplus._M_p;
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"UpdateType",(allocator<char> *)local_340);
    cmCTest::GetCTestConfiguration((string *)&e,pcVar1,(string *)&cmCTestLog_msg);
    iVar2 = DetermineType(this,pcVar6,_e);
    this->UpdateType = iVar2;
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  bVar4 = true;
  if ((this->UpdateCommand)._M_string_length == 0) {
    uVar5 = this->UpdateType - 1;
    if (uVar5 < 6) {
      pcVar6 = (&PTR_anon_var_dwarf_1b57762_008a84c8)[uVar5];
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg,pcVar6,(allocator<char> *)local_340);
      cmCTest::GetCTestConfiguration((string *)&e,pcVar1,(string *)&cmCTestLog_msg);
      std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if ((this->UpdateCommand)._M_string_length != 0) {
        return true;
      }
    }
    else {
      pcVar6 = (char *)0x0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,"Cannot find UpdateCommand ");
    if (uVar5 < 6) {
      poVar3 = std::operator<<((ostream *)&e,"or ");
      std::operator<<(poVar3,pcVar6);
    }
    std::operator<<((ostream *)&e," configuration key.");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)local_340);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)local_340);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x15c,local_340[0],false);
    std::__cxx11::string::~string((string *)local_340);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmCTestUpdateHandler::SelectVCS()
{
  // Get update command
  this->UpdateCommand = this->CTest->GetCTestConfiguration("UpdateCommand");

  // Detect the VCS managing the source tree.
  this->UpdateType = this->DetectVCS(this->GetOption("SourceDirectory"));
  if (this->UpdateType == e_UNKNOWN) {
    // The source tree does not have a recognized VCS.  Check the
    // configuration value or command name.
    this->UpdateType = this->DetermineType(
      this->UpdateCommand.c_str(),
      this->CTest->GetCTestConfiguration("UpdateType").c_str());
  }

  // If no update command was specified, lookup one for this VCS tool.
  if (this->UpdateCommand.empty()) {
    const char* key = nullptr;
    switch (this->UpdateType) {
      case e_CVS:
        key = "CVSCommand";
        break;
      case e_SVN:
        key = "SVNCommand";
        break;
      case e_BZR:
        key = "BZRCommand";
        break;
      case e_GIT:
        key = "GITCommand";
        break;
      case e_HG:
        key = "HGCommand";
        break;
      case e_P4:
        key = "P4Command";
        break;
      default:
        break;
    }
    if (key) {
      this->UpdateCommand = this->CTest->GetCTestConfiguration(key);
    }
    if (this->UpdateCommand.empty()) {
      std::ostringstream e;
      e << "Cannot find UpdateCommand ";
      if (key) {
        e << "or " << key;
      }
      e << " configuration key.";
      cmCTestLog(this->CTest, ERROR_MESSAGE, e.str() << std::endl);
      return false;
    }
  }

  return true;
}